

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

Vec2<float> __thiscall
Imath_3_2::Frustum<float>::localToScreenExc(Frustum<float> *this,Vec2<float> *p)

{
  Vec2<float> VVar1;
  domain_error *this_00;
  float *in_RDX;
  long in_RSI;
  Vec2<float> *in_RDI;
  float a;
  float a_00;
  float a_01;
  float a_02;
  float fVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float bottomMinusTop;
  float bottomPlusTop;
  float leftMinusRight;
  float leftPlusRight;
  
  a = (*(float *)(in_RSI + 0x10) - (*in_RDX + *in_RDX)) + *(float *)(in_RSI + 0x14);
  a_00 = *(float *)(in_RSI + 0x10) - *(float *)(in_RSI + 0x14);
  a_01 = (*(float *)(in_RSI + 0x1c) - (in_RDX[1] + in_RDX[1])) + *(float *)(in_RSI + 0x18);
  a_02 = *(float *)(in_RSI + 0x1c) - *(float *)(in_RSI + 0x18);
  fVar2 = abs<float>(a_00);
  if (fVar2 < 1.0) {
    fVar2 = abs<float>(a);
    fVar3 = std::numeric_limits<float>::max();
    fVar4 = abs<float>(a_00);
    if (fVar3 * fVar4 < fVar2) goto LAB_001673c5;
  }
  fVar2 = abs<float>(a_02);
  if (fVar2 < 1.0) {
    fVar2 = abs<float>(a_01);
    fVar3 = std::numeric_limits<float>::max();
    fVar4 = abs<float>(a_02);
    if (fVar3 * fVar4 < fVar2) {
LAB_001673c5:
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: local-to-screen transformation cannot be computed");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  Vec2<float>::Vec2(in_RDI,a / a_00,a_01 / a_02);
  VVar1.y = extraout_XMM0_Db;
  VVar1.x = extraout_XMM0_Da;
  return VVar1;
}

Assistant:

IMATH_CONSTEXPR14 inline Vec2<T>
Frustum<T>::localToScreenExc (const Vec2<T>& p) const
{
    T leftPlusRight  = _left - T (2) * p.x + _right;
    T leftMinusRight = _left - _right;
    T bottomPlusTop  = _bottom - T (2) * p.y + _top;
    T bottomMinusTop = _bottom - _top;

    if ((abs (leftMinusRight) < T (1) &&
         abs (leftPlusRight) >
             std::numeric_limits<T>::max () * abs (leftMinusRight)) ||
        (abs (bottomMinusTop) < T (1) &&
         abs (bottomPlusTop) >
             std::numeric_limits<T>::max () * abs (bottomMinusTop)))
    {
        throw std::domain_error (
            "Bad viewing frustum: "
            "local-to-screen transformation cannot be computed");
    }

    return Vec2<T> (
        leftPlusRight / leftMinusRight, bottomPlusTop / bottomMinusTop);
}